

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O2

void check_secfrac_convert(void)

{
  uint64_t secfracs;
  uint64_t uVar1;
  long lVar2;
  float b;
  float afStack_c0 [2];
  anon_struct_16_2_01c60da5 testvals [4];
  char teststr_s2f [30];
  char teststr_f2s [30];
  
  testvals[0].f = 0.0;
  testvals[0]._4_4_ = 0;
  testvals[0].secfracs = 0;
  testvals[1].f = 0.49;
  testvals[1]._4_4_ = 0;
  testvals[1].secfracs = 0x7d70a400;
  testvals[2].f = 0.5;
  testvals[2]._4_4_ = 0;
  testvals[2].secfracs = 0x80000000;
  testvals[3].f = 0.99999;
  testvals[3]._4_4_ = 0;
  testvals[3].secfracs = 0xffff5800;
  builtin_strncpy(teststr_f2s + 0x10,"t -> secfracs",0xe);
  builtin_strncpy(teststr_f2s,"testvals 0, floa",0x10);
  builtin_strncpy(teststr_s2f + 0x10,"racs -> float",0xe);
  builtin_strncpy(teststr_s2f,"testvals 0, secf",0x10);
  for (lVar2 = 8; lVar2 != 0x48; lVar2 = lVar2 + 0x10) {
    teststr_f2s[9] = teststr_f2s[9] + '\x01';
    teststr_s2f[9] = teststr_s2f[9] + '\x01';
    afStack_c0[1] = *(float *)((long)afStack_c0 + lVar2);
    uVar1 = rtosc_float2secfracs(afStack_c0[1]);
    secfracs = *(uint64_t *)((long)&testvals[0].f + lVar2);
    assert_true((uint)(secfracs == uVar1),teststr_f2s,0x17);
    b = rtosc_secfracs2float(secfracs);
    assert_f32_eq(afStack_c0[1],b,teststr_s2f,0x19);
  }
  return;
}

Assistant:

void check_secfrac_convert()
{
    struct
    {
        float    f;
        uint64_t secfracs;
    } testvals[] = { { 0.f,   0 },          /* 0 secfracs is always 0 */
                     { 0.49f, 2104534016},  /* 0.49 ~ max(signed int) */
                     { 0.5f,  2147483648},
                     { 0.99999f, 4294924288} };      /* 0.99 ~ max(unsigned int) */

    char teststr_f2s[] = "testvals 0, float -> secfracs";
    char teststr_s2f[] = "testvals 0, secfracs -> float";
    for(size_t i = 0; i < sizeof(testvals)/sizeof(testvals[0]); ++i)
    {
        teststr_f2s[9]++;
        teststr_s2f[9]++;
        uint64_t secfracs = rtosc_float2secfracs(testvals[i].f);
        assert_true(testvals[i].secfracs == secfracs, teststr_f2s, __LINE__);
        float f = rtosc_secfracs2float(testvals[i].secfracs);
        assert_f32_eq(testvals[i].f, f, teststr_s2f, __LINE__);
    }
}